

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O1

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *pQVar2;
  qreal qVar3;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> QVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_50 = *_a[1];
    iVar5 = 0;
    goto LAB_0039a572;
  case 1:
    local_50 = CONCAT44(local_50._4_4_,*_a[1]);
    iVar5 = 1;
LAB_0039a572:
    puStack_40 = &local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_48);
    break;
  case 2:
    setBlurRadius((QGraphicsBlurEffect *)_o,*_a[1]);
    break;
  case 3:
    setBlurHints((QGraphicsBlurEffect *)_o,
                 (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>)
                 ((QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1])->
                 super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>);
  }
  if (_c == ReadProperty) {
switchD_0039a4c2_caseD_1:
    pQVar2 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a;
    if (_id == 1) {
      QVar4.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
           (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
           QPixmapBlurFilter::blurHints(*(QPixmapBlurFilter **)(*(long *)(_o + 8) + 0xa8));
      pQVar2->super_QFlagsStorage<QGraphicsBlurEffect::BlurHint> =
           QVar4.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i;
    }
    else if (_id == 0) {
      qVar3 = QPixmapBlurFilter::radius(*(QPixmapBlurFilter **)(*(long *)(_o + 8) + 0xa8));
      *(qreal *)pQVar2 = qVar3;
    }
    if (_c != WriteProperty) goto switchD_0039a4c2_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_0039a4c2_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == blurRadiusChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0039a4c2_caseD_3;
    }
    if (((code *)*plVar1 == blurHintsChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_0039a4c2_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0039a4c2_caseD_3;
      goto switchD_0039a4c2_caseD_1;
    }
  }
  if (_id == 1) {
    setBlurHints((QGraphicsBlurEffect *)_o,
                 (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>)
                 ((QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a)->
                 super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>);
  }
  else if (_id == 0) {
    setBlurRadius((QGraphicsBlurEffect *)_o,*(qreal *)*_a);
  }
switchD_0039a4c2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsBlurEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->blurHintsChanged((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        case 2: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setBlurHints((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(qreal )>(_a, &QGraphicsBlurEffect::blurRadiusChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(BlurHints )>(_a, &QGraphicsBlurEffect::blurHintsChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 1: QtMocHelpers::assignFlags<BlurHints>(_v, _t->blurHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setBlurHints(*reinterpret_cast<BlurHints*>(_v)); break;
        default: break;
        }
    }
}